

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O3

void TTD::SnapShot::InitializeForSnapshotCompare
               (SnapShot *snap1,SnapShot *snap2,TTDCompareMap *compareMap)

{
  SnapContext *pSVar1;
  FunctionBodyResolveInfo *pFVar2;
  long lVar3;
  UnorderedArrayListLink *pUVar4;
  ulong uVar5;
  UnorderedArrayListLink *pUVar6;
  UnorderedArrayListLink *pUVar7;
  UnorderedArrayListLink *pUVar8;
  UnorderedArrayListLink *pUVar9;
  FunctionBodyResolveInfo *pFVar10;
  SnapContext *local_68;
  UnorderedArrayListLink *local_58;
  FunctionBodyResolveInfo *local_38;
  
  local_68 = (snap1->m_ctxList).m_inlineHeadBlock.CurrPos;
  pSVar1 = (snap1->m_ctxList).m_inlineHeadBlock.BlockData;
  if (pSVar1 != (SnapContext *)0x0 && pSVar1 != local_68) {
    local_58 = (snap1->m_ctxList).m_inlineHeadBlock.Next;
    do {
      if (pSVar1->LoadedTopLevelScriptCount != 0) {
        lVar3 = 8;
        uVar5 = 0;
        do {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar1->LoadedTopLevelScriptArray + lVar3 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H1FunctionTopLevelLoadMap,
                     (unsigned_long *)
                     ((long)&pSVar1->LoadedTopLevelScriptArray->TopLevelBodyCtr + lVar3),
                     (unsigned_long *)&local_38);
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < pSVar1->LoadedTopLevelScriptCount);
      }
      if (pSVar1->NewFunctionTopLevelScriptCount != 0) {
        lVar3 = 8;
        uVar5 = 0;
        do {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar1->NewFunctionTopLevelScriptArray + lVar3 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H1FunctionTopLevelNewMap,
                     (unsigned_long *)
                     ((long)&pSVar1->NewFunctionTopLevelScriptArray->TopLevelBodyCtr + lVar3),
                     (unsigned_long *)&local_38);
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < pSVar1->NewFunctionTopLevelScriptCount);
      }
      if (pSVar1->EvalTopLevelScriptCount != 0) {
        lVar3 = 8;
        uVar5 = 0;
        do {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar1->EvalTopLevelScriptArray + lVar3 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H1FunctionTopLevelEvalMap,
                     (unsigned_long *)
                     ((long)&pSVar1->EvalTopLevelScriptArray->TopLevelBodyCtr + lVar3),
                     (unsigned_long *)&local_38);
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < pSVar1->EvalTopLevelScriptCount);
      }
      pSVar1 = pSVar1 + 1;
      if (pSVar1 == local_68) {
        if (local_58 == (UnorderedArrayListLink *)0x0) break;
        local_68 = local_58->CurrPos;
        pSVar1 = local_58->BlockData;
        local_58 = local_58->Next;
      }
    } while (pSVar1 != (SnapContext *)0x0);
  }
  local_68 = (snap2->m_ctxList).m_inlineHeadBlock.CurrPos;
  pSVar1 = (snap2->m_ctxList).m_inlineHeadBlock.BlockData;
  if (pSVar1 != (SnapContext *)0x0 && pSVar1 != local_68) {
    local_58 = (snap2->m_ctxList).m_inlineHeadBlock.Next;
    do {
      if (pSVar1->LoadedTopLevelScriptCount != 0) {
        lVar3 = 8;
        uVar5 = 0;
        do {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar1->LoadedTopLevelScriptArray + lVar3 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H2FunctionTopLevelLoadMap,
                     (unsigned_long *)
                     ((long)&pSVar1->LoadedTopLevelScriptArray->TopLevelBodyCtr + lVar3),
                     (unsigned_long *)&local_38);
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < pSVar1->LoadedTopLevelScriptCount);
      }
      if (pSVar1->NewFunctionTopLevelScriptCount != 0) {
        lVar3 = 8;
        uVar5 = 0;
        do {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar1->NewFunctionTopLevelScriptArray + lVar3 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H2FunctionTopLevelNewMap,
                     (unsigned_long *)
                     ((long)&pSVar1->NewFunctionTopLevelScriptArray->TopLevelBodyCtr + lVar3),
                     (unsigned_long *)&local_38);
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < pSVar1->NewFunctionTopLevelScriptCount);
      }
      if (pSVar1->EvalTopLevelScriptCount != 0) {
        lVar3 = 8;
        uVar5 = 0;
        do {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar1->EvalTopLevelScriptArray + lVar3 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H2FunctionTopLevelEvalMap,
                     (unsigned_long *)
                     ((long)&pSVar1->EvalTopLevelScriptArray->TopLevelBodyCtr + lVar3),
                     (unsigned_long *)&local_38);
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < pSVar1->EvalTopLevelScriptCount);
      }
      pSVar1 = pSVar1 + 1;
      if (pSVar1 == local_68) {
        if (local_58 == (UnorderedArrayListLink *)0x0) break;
        local_68 = local_58->CurrPos;
        pSVar1 = local_58->BlockData;
        local_58 = local_58->Next;
      }
    } while (pSVar1 != (SnapContext *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap1->m_primitiveObjectList).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap1->m_primitiveObjectList).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar6 = (snap1->m_primitiveObjectList).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H1ValueMap,&pFVar10->FunctionBodyId,
                 (SnapPrimitiveValue **)&local_38);
      pFVar10 = (FunctionBodyResolveInfo *)&pFVar10->OptKnownPath;
      if (pFVar10 == pFVar2) {
        if (pUVar6 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = (FunctionBodyResolveInfo *)pUVar6->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar6->BlockData;
        pUVar6 = pUVar6->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap2->m_primitiveObjectList).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap2->m_primitiveObjectList).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar6 = (snap2->m_primitiveObjectList).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H2ValueMap,&pFVar10->FunctionBodyId,
                 (SnapPrimitiveValue **)&local_38);
      pFVar10 = (FunctionBodyResolveInfo *)&pFVar10->OptKnownPath;
      if (pFVar10 == pFVar2) {
        if (pUVar6 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = (FunctionBodyResolveInfo *)pUVar6->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar6->BlockData;
        pUVar6 = pUVar6->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap1->m_slotArrayEntries).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap1->m_slotArrayEntries).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar7 = (snap1->m_slotArrayEntries).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H1SlotArrayMap,&pFVar10->FunctionBodyId,(SlotArrayInfo **)&local_38
                );
      pFVar10 = (FunctionBodyResolveInfo *)&(pFVar10->ScopeChainInfo).ScopeArray;
      if (pFVar10 == pFVar2) {
        if (pUVar7 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = (FunctionBodyResolveInfo *)pUVar7->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar7->BlockData;
        pUVar7 = pUVar7->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap2->m_slotArrayEntries).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap2->m_slotArrayEntries).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar7 = (snap2->m_slotArrayEntries).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H2SlotArrayMap,&pFVar10->FunctionBodyId,(SlotArrayInfo **)&local_38
                );
      pFVar10 = (FunctionBodyResolveInfo *)&(pFVar10->ScopeChainInfo).ScopeArray;
      if (pFVar10 == pFVar2) {
        if (pUVar7 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = (FunctionBodyResolveInfo *)pUVar7->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar7->BlockData;
        pUVar7 = pUVar7->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap1->m_scopeEntries).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap1->m_scopeEntries).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar8 = (snap1->m_scopeEntries).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H1FunctionScopeInfoMap,&pFVar10->FunctionBodyId,
                 (ScriptFunctionScopeInfo **)&local_38);
      pFVar10 = (FunctionBodyResolveInfo *)&pFVar10->OptKnownPath;
      if (pFVar10 == pFVar2) {
        if (pUVar8 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = (FunctionBodyResolveInfo *)pUVar8->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar8->BlockData;
        pUVar8 = pUVar8->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap2->m_scopeEntries).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap2->m_scopeEntries).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar8 = (snap2->m_scopeEntries).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H2FunctionScopeInfoMap,&pFVar10->FunctionBodyId,
                 (ScriptFunctionScopeInfo **)&local_38);
      pFVar10 = (FunctionBodyResolveInfo *)&pFVar10->OptKnownPath;
      if (pFVar10 == pFVar2) {
        if (pUVar8 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = (FunctionBodyResolveInfo *)pUVar8->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar8->BlockData;
        pUVar8 = pUVar8->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (snap1->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  pFVar10 = (snap1->m_functionBodyList).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar9 = (snap1->m_functionBodyList).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H1FunctionBodyMap,&pFVar10->FunctionBodyId,&local_38);
      pFVar10 = pFVar10 + 1;
      if (pFVar10 == pFVar2) {
        if (pUVar9 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = pUVar9->CurrPos;
        pFVar10 = pUVar9->BlockData;
        pUVar9 = pUVar9->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (snap2->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  pFVar10 = (snap2->m_functionBodyList).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar9 = (snap2->m_functionBodyList).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H2FunctionBodyMap,&pFVar10->FunctionBodyId,&local_38);
      pFVar10 = pFVar10 + 1;
      if (pFVar10 == pFVar2) {
        if (pUVar9 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = pUVar9->CurrPos;
        pFVar10 = pUVar9->BlockData;
        pUVar9 = pUVar9->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap1->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap1->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar4 = (snap1->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H1ObjectMap,&pFVar10->FunctionBodyId,(SnapObject **)&local_38);
      pFVar10 = (FunctionBodyResolveInfo *)&(pFVar10->ScopeChainInfo).ScopeArray;
      if (pFVar10 == pFVar2) {
        if (pUVar4 == (UnorderedArrayListLink *)0x0) break;
        pFVar2 = (FunctionBodyResolveInfo *)pUVar4->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar4->BlockData;
        pUVar4 = pUVar4->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  pFVar2 = (FunctionBodyResolveInfo *)(snap2->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pFVar10 = (FunctionBodyResolveInfo *)(snap2->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pFVar10 != (FunctionBodyResolveInfo *)0x0 && pFVar10 != pFVar2) {
    pUVar4 = (snap2->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      local_38 = pFVar10;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&compareMap->H2ObjectMap,&pFVar10->FunctionBodyId,(SnapObject **)&local_38);
      pFVar10 = (FunctionBodyResolveInfo *)&(pFVar10->ScopeChainInfo).ScopeArray;
      if (pFVar10 == pFVar2) {
        if (pUVar4 == (UnorderedArrayListLink *)0x0) {
          return;
        }
        pFVar2 = (FunctionBodyResolveInfo *)pUVar4->CurrPos;
        pFVar10 = (FunctionBodyResolveInfo *)pUVar4->BlockData;
        pUVar4 = pUVar4->Next;
      }
    } while (pFVar10 != (FunctionBodyResolveInfo *)0x0);
  }
  return;
}

Assistant:

void SnapShot::InitializeForSnapshotCompare(const SnapShot* snap1, const SnapShot* snap2, TTDCompareMap& compareMap)
    {
        ////
        //Initialize all of the maps

        //top-level functions
        for(auto iter = snap1->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx = iter.Current();

            for(uint32 i = 0; i < ctx->LoadedTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelLoadMap.AddNew(ctx->LoadedTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->LoadedTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->NewFunctionTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelNewMap.AddNew(ctx->NewFunctionTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->NewFunctionTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->EvalTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelEvalMap.AddNew(ctx->EvalTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->EvalTopLevelScriptArray[i].TopLevelBodyCtr);
            }
        }

        for(auto iter = snap2->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx = iter.Current();

            for(uint32 i = 0; i < ctx->LoadedTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelLoadMap.AddNew(ctx->LoadedTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->LoadedTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->NewFunctionTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelNewMap.AddNew(ctx->NewFunctionTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->NewFunctionTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->EvalTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelEvalMap.AddNew(ctx->EvalTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->EvalTopLevelScriptArray[i].TopLevelBodyCtr);
            }
        }

        //Values and things
        for(auto iter = snap1->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1ValueMap.AddNew(iter.Current()->PrimitiveValueId, iter.Current());
        }

        for(auto iter = snap2->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2ValueMap.AddNew(iter.Current()->PrimitiveValueId, iter.Current());
        }

        for(auto iter = snap1->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1SlotArrayMap.AddNew(iter.Current()->SlotId, iter.Current());
        }

        for(auto iter = snap2->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2SlotArrayMap.AddNew(iter.Current()->SlotId, iter.Current());
        }

        for(auto iter = snap1->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1FunctionScopeInfoMap.AddNew(iter.Current()->ScopeId, iter.Current());
        }

        for(auto iter = snap2->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2FunctionScopeInfoMap.AddNew(iter.Current()->ScopeId, iter.Current());
        }

        //Bodies and objects
        for(auto iter = snap1->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1FunctionBodyMap.AddNew(iter.Current()->FunctionBodyId, iter.Current());
        }

        for(auto iter = snap2->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2FunctionBodyMap.AddNew(iter.Current()->FunctionBodyId, iter.Current());
        }

        for(auto iter = snap1->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1ObjectMap.AddNew(iter.Current()->ObjectPtrId, iter.Current());
        }

        for(auto iter = snap2->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2ObjectMap.AddNew(iter.Current()->ObjectPtrId, iter.Current());
        }
    }